

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

float * stbi__loadf_main(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  int a;
  int b;
  int iVar1;
  float *pfVar2;
  uchar *__ptr;
  long lVar3;
  char *pcVar4;
  uint uVar5;
  long lVar6;
  uchar *puVar7;
  float *pfVar8;
  stbi__result_info *in_R9;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  long in_FS_OFFSET;
  bool bVar14;
  double dVar15;
  
  iVar1 = stbi__hdr_test(s);
  if (iVar1 == 0) {
    iVar1 = req_comp;
    __ptr = stbi__load_and_postprocess_8bit(s,x,y,comp,req_comp);
    if (__ptr == (uchar *)0x0) {
      pcVar4 = "Image not of any known type, or corrupt";
    }
    else {
      a = *x;
      b = *y;
      if (req_comp == 0) {
        req_comp = *comp;
      }
      pfVar2 = (float *)stbi__malloc_mad4(a,b,req_comp,4,iVar1);
      if (pfVar2 != (float *)0x0) {
        uVar10 = 0;
        uVar5 = req_comp - (uint)((req_comp & 1U) == 0);
        uVar12 = b * a;
        uVar11 = 0;
        if (0 < (int)uVar5) {
          uVar11 = (ulong)uVar5;
        }
        lVar6 = (long)req_comp;
        puVar7 = __ptr;
        pfVar8 = pfVar2;
        uVar13 = (ulong)uVar12;
        if ((int)uVar12 < 1) {
          uVar13 = uVar10;
        }
        for (; uVar10 != uVar13; uVar10 = uVar10 + 1) {
          for (uVar9 = 0; uVar11 != uVar9; uVar9 = uVar9 + 1) {
            dVar15 = pow((double)((float)puVar7[uVar9] / 255.0),(double)stbi__l2h_gamma);
            pfVar8[uVar9] = (float)((double)stbi__l2h_scale * dVar15);
          }
          puVar7 = puVar7 + lVar6;
          pfVar8 = pfVar8 + lVar6;
        }
        if ((req_comp & 1U) == 0) {
          lVar3 = (long)(int)uVar5;
          while (bVar14 = uVar13 != 0, uVar13 = uVar13 - 1, bVar14) {
            pfVar2[lVar3] = (float)__ptr[lVar3] / 255.0;
            lVar3 = lVar3 + lVar6;
          }
        }
        free(__ptr);
        return pfVar2;
      }
      free(__ptr);
      pcVar4 = "Out of memory";
    }
    *(char **)(in_FS_OFFSET + -0x20) = pcVar4;
    pfVar2 = (float *)0x0;
  }
  else {
    pfVar2 = stbi__hdr_load(s,x,y,comp,req_comp,in_R9);
    if (pfVar2 != (float *)0x0) {
      iVar1 = stbi__vertically_flip_on_load_global;
      if (*(int *)(in_FS_OFFSET + -0x14) != 0) {
        iVar1 = *(int *)(in_FS_OFFSET + -0x18);
      }
      if (iVar1 != 0) {
        if (req_comp == 0) {
          req_comp = *comp;
        }
        stbi__vertical_flip(pfVar2,*x,*y,req_comp << 2);
      }
    }
  }
  return pfVar2;
}

Assistant:

static float *stbi__loadf_main(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   unsigned char *data;
   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      stbi__result_info ri;
      float *hdr_data = stbi__hdr_load(s,x,y,comp,req_comp, &ri);
      if (hdr_data)
         stbi__float_postprocess(hdr_data,x,y,comp,req_comp);
      return hdr_data;
   }
   #endif
   data = stbi__load_and_postprocess_8bit(s, x, y, comp, req_comp);
   if (data)
      return stbi__ldr_to_hdr(data, *x, *y, req_comp ? req_comp : *comp);
   return stbi__errpf("unknown image type", "Image not of any known type, or corrupt");
}